

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.h
# Opt level: O2

__pid_t __thiscall sznet::Condition::wait(Condition *this,void *__stat_loc)

{
  int iVar1;
  __pid_t extraout_EAX;
  SourceFile file;
  Logger local_ff8;
  undefined1 local_28 [12];
  UnassignGuard local_18;
  UnassignGuard ug;
  
  local_18.m_owner = this->m_mutex;
  (((sz_mutex_t *)((long)local_18.m_owner + 0x28))->__data).__lock = 0;
  iVar1 = sz_cond_wait(&this->m_cond,&(local_18.m_owner)->m_mutex);
  if (iVar1 != 0) {
    Logger::SourceFile::SourceFile<108>
              ((SourceFile *)local_28,
               (char (*) [108])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/../thread/Condition.h"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_28._0_8_;
    file.m_size = local_28._8_4_;
    Logger::Logger(&local_ff8,file,0x22,true);
    LogStream::operator<<(&local_ff8.m_impl.m_stream,"Failed in sz_cond_wait");
    Logger::~Logger(&local_ff8);
  }
  MutexLock::UnassignGuard::~UnassignGuard(&local_18);
  return extraout_EAX;
}

Assistant:

void wait()
	{
		MutexLock::UnassignGuard ug(m_mutex);
		auto rst = sz_cond_wait(&m_cond, m_mutex.getPthreadMutex());
		if (rst != 0)
		{
			LOG_SYSFATAL << "Failed in sz_cond_wait";
		}
	}